

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O3

void __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::serialize
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,string *str)

{
  string value_str;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
  map;
  string local_50;
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
  local_30;
  
  util::
  map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>
  ::
  copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>,ylt::util::map_sharded_t<std::unordered_map<std::span<std::__cxx11::string_const,2ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<131ul>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_equal,std::allocator<std::pair<std::span<std::__cxx11::string_const,2ul>const,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::value_type>>>,ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::my_hash<137ul>>::copy<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>>()const::_lambda(auto:1&)_1_>
            (&local_30,
             &(this->super_dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>).map_,
             (anon_class_1_0_00000001 *)&local_50);
  if (local_30.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_30.
      super__Vector_base<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    basic_dynamic_counter<long,(unsigned_char)2>::
    serialize_map<std::vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>,std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,(unsigned_char)2>::metric_pair>>>>
              ((basic_dynamic_counter<long,(unsigned_char)2> *)this,&local_30,&local_50);
    if (local_50._M_string_length != 0) {
      metric_t::serialize_head((metric_t *)this,str);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (str,local_50._M_dataplus._M_p,local_50._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  std::
  vector<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>,_std::allocator<std::shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::metric_pair>_>_>
  ::~vector(&local_30);
  return;
}

Assistant:

void serialize(std::string &str) override {
    auto map = Base::copy();
    if (map.empty()) {
      return;
    }

    std::string value_str;
    serialize_map(map, value_str);
    if (!value_str.empty()) {
      Base::serialize_head(str);
      str.append(value_str);
    }
  }